

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_rectfill_rgba(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  uint *dest;
  uint uVar1;
  
  dest = (uint *)rasterBuffer->m_buffer;
  uVar1 = QRgba64::toArgb32(color);
  qt_rectfill<unsigned_int>
            (dest,(uVar1 & 0xff00ff) << 0x10 | uVar1 & 0xff00ff00 | (uVar1 & 0xff00ff) >> 0x10,x,y,
             width,height,rasterBuffer->bytes_per_line);
  return;
}

Assistant:

static void qt_rectfill_rgba(QRasterBuffer *rasterBuffer,
                             int x, int y, int width, int height,
                             const QRgba64 &color)
{
    qt_rectfill<quint32>(reinterpret_cast<quint32 *>(rasterBuffer->buffer()),
                         ARGB2RGBA(color.toArgb32()), x, y, width, height, rasterBuffer->bytesPerLine());
}